

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  int iVar1;
  FdOutputStream out;
  FdInputStream in;
  int fds [2];
  byte buf [6];
  Fault f;
  FdOutputStream local_108;
  FdInputStream local_f8;
  int local_e8 [2];
  OwnFd local_e0;
  OwnFd local_dc;
  ArrayPtr<unsigned_char> local_d8;
  ArrayPtr<const_unsigned_char> local_c8;
  uchar local_b8 [8];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined3 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined3 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_e8[0] = 0;
  local_e8[1] = 0;
  do {
    iVar1 = pipe(local_e8);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    local_f8.super_InputStream._vptr_InputStream = (_func_int **)&PTR__FdInputStream_00239700;
    local_f8.fd = local_e8[0];
    local_f8.autoclose.fd = local_e8[0];
    local_dc.fd = -1;
    OwnFd::~OwnFd(&local_dc);
    local_108.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__FdOutputStream_00239730;
    local_108.fd = local_e8[1];
    local_108.autoclose.fd = local_e8[1];
    local_e0.fd = -1;
    OwnFd::~OwnFd(&local_e0);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = &_::ByteLiteral<4ul>;
    local_60 = 3;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = &_::ByteLiteral<4ul>;
    local_40 = 3;
    local_38 = 0;
    uStack_30 = 0;
    FdOutputStream::write(&local_108,(int)&local_78,&DAT_00000005,0x1e81c0);
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    InputStream::read(&local_f8.super_InputStream,(int)local_b8,(void *)0x6,6);
    local_c8.ptr = 
    "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
    ;
    local_c8.size_ = 6;
    local_d8.size_ = 6;
    local_d8.ptr = local_b8;
    _::DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
              ((DebugExpression<kj::ArrayPtr<const_unsigned_char>_> *)&local_c8,&local_d8);
    if ((local_b0.result == false) && (_::Debug::minSeverity < 3)) {
      local_c8.ptr = 
      "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
      ;
      local_c8.size_ = 6;
      local_d8.size_ = 6;
      local_d8.ptr = local_b8;
      _::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
                 ,0x38,ERROR,
                 "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf)"
                 ,(char (*) [51])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf))",&local_b0,
                 &local_c8,&local_d8);
    }
    FdOutputStream::~FdOutputStream(&local_108);
    FdInputStream::~FdInputStream(&local_f8);
    return;
  }
  local_b0.left.ptr = (uchar *)0x0;
  local_78 = 0;
  uStack_70 = 0;
  _::Debug::Fault::init
            ((Fault *)&local_b0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
            );
  _::Debug::Fault::fatal((Fault *)&local_b0);
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2]{};
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((OwnFd(fds[0])));
  FdOutputStream out((OwnFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "foo"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "bar"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  byte buf[6]{};
  in.read(buf);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf));
}